

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

TypeNameMap * google::protobuf::compiler::anon_unknown_0::GetTypeNameTable(void)

{
  int iVar1;
  TypeNameMap *__return_storage_ptr__;
  anon_class_1_0_00000001 local_15 [13];
  
  if (compiler::(anonymous_namespace)::GetTypeNameTable()::table == '\0') {
    iVar1 = __cxa_guard_acquire(&compiler::(anonymous_namespace)::GetTypeNameTable()::table);
    if (iVar1 != 0) {
      __return_storage_ptr__ = (TypeNameMap *)operator_new(0x20);
      GetTypeNameTable::anon_class_1_0_00000001::operator()(__return_storage_ptr__,local_15);
      GetTypeNameTable::table = __return_storage_ptr__;
      __cxa_guard_release(&compiler::(anonymous_namespace)::GetTypeNameTable()::table);
    }
  }
  return GetTypeNameTable::table;
}

Assistant:

const TypeNameMap& GetTypeNameTable() {
  static auto* table = new auto([]() {
    TypeNameMap result;

    result["double"] = FieldDescriptorProto::TYPE_DOUBLE;
    result["float"] = FieldDescriptorProto::TYPE_FLOAT;
    result["uint64"] = FieldDescriptorProto::TYPE_UINT64;
    result["fixed64"] = FieldDescriptorProto::TYPE_FIXED64;
    result["fixed32"] = FieldDescriptorProto::TYPE_FIXED32;
    result["bool"] = FieldDescriptorProto::TYPE_BOOL;
    result["string"] = FieldDescriptorProto::TYPE_STRING;
    result["group"] = FieldDescriptorProto::TYPE_GROUP;

    result["bytes"] = FieldDescriptorProto::TYPE_BYTES;
    result["uint32"] = FieldDescriptorProto::TYPE_UINT32;
    result["sfixed32"] = FieldDescriptorProto::TYPE_SFIXED32;
    result["sfixed64"] = FieldDescriptorProto::TYPE_SFIXED64;
    result["int32"] = FieldDescriptorProto::TYPE_INT32;
    result["int64"] = FieldDescriptorProto::TYPE_INT64;
    result["sint32"] = FieldDescriptorProto::TYPE_SINT32;
    result["sint64"] = FieldDescriptorProto::TYPE_SINT64;

    return result;
  }());
  return *table;
}